

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O1

void __thiscall
flatbuffers::swift::SwiftGenerator::GenTableReaderVectorFields(SwiftGenerator *this,FieldDef *field)

{
  uint uVar1;
  CodeWriter *this_00;
  IdlNamer *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  StructDef *pSVar4;
  size_t t;
  mapped_type *pmVar5;
  long *plVar6;
  undefined8 *puVar7;
  pointer ppFVar8;
  size_t sVar9;
  size_type *psVar10;
  ulong *puVar11;
  undefined8 uVar12;
  char *pcVar13;
  long *****ppppplVar14;
  char *pcVar15;
  _Alloc_hider _Var16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  bool bVar18;
  size_type __dnew;
  size_type __dnew_3;
  Type vectortype;
  size_type __dnew_4;
  string const_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  key_type local_320;
  string local_300;
  string local_2e0;
  SwiftGenerator *local_2c0;
  string local_2b8;
  long ****local_298;
  long ****local_290;
  long ****local_288 [2];
  Type local_278;
  string local_258;
  string local_238;
  long *local_218;
  long local_210;
  long local_208 [2];
  string local_1f8;
  IdlNamer *local_1d8;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_218 = local_208;
  local_2c0 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_218,"return o == 0 ? {{CONSTANT}} : ","");
  local_278.base_type = (field->value).type.element;
  local_278.struct_def._0_4_ = *(undefined4 *)&(field->value).type.struct_def;
  local_278.struct_def._4_4_ = *(undefined4 *)((long)&(field->value).type.struct_def + 4);
  local_278.enum_def._0_4_ = *(undefined4 *)&(field->value).type.enum_def;
  local_278.enum_def._4_4_ = *(undefined4 *)((long)&(field->value).type.enum_def + 4);
  local_278.fixed_length = (field->value).type.fixed_length;
  local_278.element = BASE_TYPE_NONE;
  paVar2 = &local_320.field_2;
  local_320._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"SIZE","");
  t = InlineSize(&local_278);
  NumToString<unsigned_long>(&local_300,t);
  this_00 = &local_2c0->code_;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_320);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  paVar17 = &local_300.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar17) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  local_320._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"HAS_FIELDVAR","");
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"has","");
  this_01 = &local_2c0->namer_;
  Namer::Variable<flatbuffers::FieldDef>(&local_300,&this_01->super_Namer,&local_2e0,field);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_320);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar17) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,(ulong)(local_2e0.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  local_2e0._M_dataplus._M_p = (pointer)0x39;
  local_300._M_dataplus._M_p = (pointer)paVar17;
  local_300._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_300,(ulong)&local_2e0);
  local_300.field_2._M_allocated_capacity = (size_type)local_2e0._M_dataplus._M_p;
  builtin_strncpy(local_300._M_dataplus._M_p,
                  "let o = {{ACCESS}}.offset({{TABLEOFFSET}}.{{OFFSET}}.v); ",0x39);
  local_300._M_string_length = (size_type)local_2e0._M_dataplus._M_p;
  local_300._M_dataplus._M_p[(long)local_2e0._M_dataplus._M_p] = '\0';
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0x383e54);
  psVar10 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_320.field_2._M_allocated_capacity = *psVar10;
    local_320.field_2._8_8_ = plVar6[3];
    local_320._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_320.field_2._M_allocated_capacity = *psVar10;
    local_320._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_320._M_string_length = plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_1d8 = this_01;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_320);
  psVar10 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_150.field_2._M_allocated_capacity = *psVar10;
    local_150.field_2._8_8_ = plVar6[3];
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  }
  else {
    local_150.field_2._M_allocated_capacity = *psVar10;
    local_150._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_150._M_string_length = plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  CodeWriter::operator+=(this_00,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar17) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  local_2e0._M_dataplus._M_p = (pointer)0x39;
  local_300._M_dataplus._M_p = (pointer)paVar17;
  local_300._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_300,(ulong)&local_2e0);
  local_300.field_2._M_allocated_capacity = (size_type)local_2e0._M_dataplus._M_p;
  builtin_strncpy(local_300._M_dataplus._M_p,
                  "let o = {{ACCESS}}.offset({{TABLEOFFSET}}.{{OFFSET}}.v); ",0x39);
  local_300._M_string_length = (size_type)local_2e0._M_dataplus._M_p;
  local_300._M_dataplus._M_p[(long)local_2e0._M_dataplus._M_p] = '\0';
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0x383ea1);
  psVar10 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_320.field_2._M_allocated_capacity = *psVar10;
    local_320.field_2._8_8_ = plVar6[3];
    local_320._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_320.field_2._M_allocated_capacity = *psVar10;
    local_320._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_320._M_string_length = plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_320);
  psVar10 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_170.field_2._M_allocated_capacity = *psVar10;
    local_170.field_2._8_8_ = plVar6[3];
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  }
  else {
    local_170.field_2._M_allocated_capacity = *psVar10;
    local_170._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_170._M_string_length = plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  CodeWriter::operator+=(this_00,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar17) {
    operator_delete(local_300._M_dataplus._M_p,(ulong)(local_300.field_2._M_allocated_capacity + 1))
    ;
  }
  local_320._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"CONSTANT","");
  bVar18 = 0xb < local_278.base_type - BASE_TYPE_UTYPE;
  pcVar13 = "nil";
  if (!bVar18) {
    pcVar13 = "0";
  }
  local_300._M_dataplus._M_p = (pointer)paVar17;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_300,pcVar13,pcVar13 + (ulong)bVar18 * 2 + 1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_320);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar17) {
    operator_delete(local_300._M_dataplus._M_p,(ulong)(local_300.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if (local_278.base_type - BASE_TYPE_UTYPE < 0xc) {
    pcVar13 = "?";
    if (CONCAT44(local_278.enum_def._4_4_,local_278.enum_def._0_4_) == 0) {
      pcVar13 = "";
    }
    if (9 < local_278.base_type - BASE_TYPE_UTYPE) {
      pcVar13 = "";
    }
  }
  else {
    pcVar13 = "?";
  }
  if (local_278.base_type == BASE_TYPE_UNION) {
    local_2e0._M_dataplus._M_p = (pointer)0x39;
    local_300._M_dataplus._M_p = (pointer)paVar17;
    local_300._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_300,(ulong)&local_2e0);
    local_300.field_2._M_allocated_capacity = (size_type)local_2e0._M_dataplus._M_p;
    builtin_strncpy((char *)((long)local_300._M_dataplus._M_p + 0x29),".{{OFFSE",8);
    builtin_strncpy((char *)((long)local_300._M_dataplus._M_p + 0x31),"T}}.v); ",8);
    *(undefined8 *)((long)local_300._M_dataplus._M_p + 0x20) = 0x7d54455346464f45;
    *(undefined8 *)((long)local_300._M_dataplus._M_p + 0x28) = 0x5346464f7b7b2e7d;
    *(undefined8 *)((long)local_300._M_dataplus._M_p + 0x10) = 0x657366666f2e7d7d;
    *(undefined8 *)((long)local_300._M_dataplus._M_p + 0x18) = 0x4c4241547b7b2874;
    *(undefined8 *)local_300._M_dataplus._M_p = 0x203d206f2074656c;
    *(undefined8 *)((long)local_300._M_dataplus._M_p + 8) = 0x5353454343417b7b;
    local_300._M_string_length = (size_type)local_2e0._M_dataplus._M_p;
    local_300._M_dataplus._M_p[(long)local_2e0._M_dataplus._M_p] = '\0';
    puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0x383f03);
    puVar11 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_320.field_2._M_allocated_capacity = *puVar11;
      local_320.field_2._8_8_ = puVar7[3];
      local_320._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_320.field_2._M_allocated_capacity = *puVar11;
      local_320._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_320._M_string_length = puVar7[1];
    *puVar7 = puVar11;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_320);
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_1b0.field_2._M_allocated_capacity = *psVar10;
      local_1b0.field_2._8_8_ = plVar6[3];
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    }
    else {
      local_1b0.field_2._M_allocated_capacity = *psVar10;
      local_1b0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1b0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    CodeWriter::operator+=(this_00,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != paVar2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    uVar12 = local_300.field_2._M_allocated_capacity;
    _Var16._M_p = local_300._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
LAB_002f247d:
      operator_delete(_Var16._M_p,(ulong)(uVar12 + 1));
    }
  }
  else {
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    sVar9 = strlen(pcVar13);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,pcVar13,pcVar13 + sVar9);
    anon_unknown_1::GenArrayMainBody(&local_300,&local_2e0);
    paVar3 = &local_2b8.field_2;
    local_298 = (long ****)0x39;
    local_2b8._M_dataplus._M_p = (pointer)paVar3;
    local_2b8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_2b8,(ulong)&local_298);
    local_2b8.field_2._M_allocated_capacity = (size_type)local_298;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x29) = '.';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x2a) = '{';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x2b) = '{';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x2c) = 'O';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x2d) = 'F';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x2e) = 'F';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x2f) = 'S';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x30) = 'E';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x31) = 'T';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x32) = '}';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x33) = '}';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x34) = '.';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x35) = 'v';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x36) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x37) = ';';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x38) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x20) = 'E';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x21) = 'O';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x22) = 'F';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x23) = 'F';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x24) = 'S';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x25) = 'E';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x26) = 'T';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x27) = '}';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x28) = '}';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x29) = '.';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x2a) = '{';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x2b) = '{';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x2c) = 'O';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x2d) = 'F';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x2e) = 'F';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x2f) = 'S';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x10) = '}';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x11) = '}';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x12) = '.';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x13) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x14) = 'f';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x15) = 'f';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x16) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x17) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x18) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x19) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x1a) = '{';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x1b) = '{';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x1c) = 'T';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x1d) = 'A';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x1e) = 'B';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0x1f) = 'L';
    *(undefined8 *)local_2b8._M_dataplus._M_p = 0x203d206f2074656c;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 8) = '{';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 9) = '{';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 10) = 'A';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0xb) = 'C';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0xc) = 'C';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0xd) = 'E';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0xe) = 'S';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p + 0xf) = 'S';
    local_2b8._M_string_length = (size_type)local_298;
    local_2b8._M_dataplus._M_p[(long)local_298] = '\0';
    uVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != paVar17) {
      uVar12 = local_300.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < (long *****)((long)local_298 + local_300._M_string_length)) {
      ppppplVar14 = (long *****)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != paVar3) {
        ppppplVar14 = (long *****)local_298;
      }
      if (ppppplVar14 < (long *****)((long)local_298 + local_300._M_string_length))
      goto LAB_002f224a;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_2b8,0,(char *)0x0,(ulong)local_300._M_dataplus._M_p);
    }
    else {
LAB_002f224a:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_2b8._M_dataplus._M_p)
      ;
    }
    puVar11 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_320.field_2._M_allocated_capacity = *puVar11;
      local_320.field_2._8_8_ = puVar7[3];
      local_320._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_320.field_2._M_allocated_capacity = *puVar11;
      local_320._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_320._M_string_length = puVar7[1];
    *puVar7 = puVar11;
    puVar7[1] = 0;
    *(undefined1 *)puVar11 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_320);
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_190.field_2._M_allocated_capacity = *psVar10;
      local_190.field_2._8_8_ = plVar6[3];
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    }
    else {
      local_190.field_2._M_allocated_capacity = *psVar10;
      local_190._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_190._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    CodeWriter::operator+=(this_00,&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != paVar2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != paVar3) {
      operator_delete(local_2b8._M_dataplus._M_p,
                      (ulong)(local_2b8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,
                      (ulong)(local_300.field_2._M_allocated_capacity + 1));
    }
    uVar12 = local_2e0.field_2._M_allocated_capacity;
    _Var16._M_p = local_2e0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) goto LAB_002f247d;
  }
  paVar17 = &local_300.field_2;
  if (local_278.base_type == BASE_TYPE_BOOL) {
    local_320._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"CONSTANT","");
    bVar18 = (field->value).offset == 0;
    pcVar15 = "true";
    if (bVar18) {
      pcVar15 = "false";
    }
    local_300._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_300,pcVar15,pcVar15 + (ulong)bVar18 + 4);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this_00->value_map_,&local_320);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != paVar17) {
      operator_delete(local_300._M_dataplus._M_p,
                      (ulong)(local_300.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != paVar2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    local_320._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"VALUETYPE","");
    local_300._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"Bool","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this_00->value_map_,&local_320);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != paVar17) {
      operator_delete(local_300._M_dataplus._M_p,
                      (ulong)(local_300.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != paVar2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
  }
  if ((CONCAT44(local_278.enum_def._4_4_,local_278.enum_def._0_4_) == 0) ||
     (9 < local_278.base_type - BASE_TYPE_UTYPE)) {
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,local_218,local_210 + (long)local_218);
    std::__cxx11::string::append((char *)&local_1f8);
    CodeWriter::operator+=(this_00,&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
  }
  uVar1 = local_278.base_type - BASE_TYPE_UTYPE;
  if (((uVar1 < 0xc) &&
      (9 < uVar1 || CONCAT44(local_278.enum_def._4_4_,local_278.enum_def._0_4_) == 0)) &&
     ((field->value).type.base_type != BASE_TYPE_BOOL)) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,
               "{{ACCESS}}.directRead(of: {{VALUETYPE}}.self, offset: {{ACCESS}}.vector(at: o) + index * {{SIZE}}) }"
               ,"");
    CodeWriter::operator+=(this_00,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,
               "{{ACCESS_TYPE}} var {{FIELDVAR}}: [{{VALUETYPE}}] { return {{ACCESS}}.getVector(at: {{TABLEOFFSET}}.{{OFFSET}}.v) ?? [] }"
               ,"");
    CodeWriter::operator+=(this_00,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((((local_2c0->super_BaseGenerator).parser_)->opts).mutable_buffer == true) {
      GenMutateArray_abi_cxx11_(&local_50,local_2c0);
      CodeWriter::operator+=(this_00,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_002f3135:
        operator_delete(local_50._M_dataplus._M_p,
                        (ulong)(local_50.field_2._M_allocated_capacity + 1));
      }
    }
LAB_002f313d:
    GenUnsafeBufferPointer(local_2c0,field);
  }
  else {
    if (local_278.base_type == BASE_TYPE_STRING) {
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,
                 "{{ACCESS}}.directString(at: {{ACCESS}}.vector(at: o) + index * {{SIZE}}) }","");
      CodeWriter::operator+=(this_00,&local_110);
      _Var16._M_p = local_110._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p == &local_110.field_2) goto LAB_002f314a;
    }
    else {
      if ((local_278.base_type == BASE_TYPE_STRUCT) &&
         (((field->value).type.struct_def)->fixed == true)) {
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,
                   "{{ACCESS}}.directRead(of: {{VALUETYPE}}.self, offset: {{ACCESS}}.vector(at: o) + index * {{SIZE}}) }"
                   ,"");
        CodeWriter::operator+=(this_00,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        local_320._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"FIELDMETHOD","");
        paVar17 = &local_300.field_2;
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"mutable","");
        (*(local_1d8->super_Namer)._vptr_Namer[3])(&local_300,local_1d8,&local_2e0);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this_00->value_map_,&local_320);
        std::__cxx11::string::_M_assign((string *)pmVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != paVar17) {
          operator_delete(local_300._M_dataplus._M_p,
                          (ulong)(local_300.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,
                          (ulong)(local_2e0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != paVar2) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        local_320._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"VALUETYPE","");
        GenType_abi_cxx11_(&local_2e0,local_2c0,&(field->value).type,false);
        paVar3 = &local_2b8.field_2;
        local_2b8.field_2._M_allocated_capacity = 0x656c626174754d5f;
        local_2b8._M_string_length = 8;
        local_2b8.field_2._M_local_buf[8] = '\0';
        uVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          uVar12 = local_2e0.field_2._M_allocated_capacity;
        }
        local_2b8._M_dataplus._M_p = (pointer)paVar3;
        if (((long *****)(local_2e0._M_string_length + 8) < (long *****)0x10) &&
           ((ulong)uVar12 < (long *****)(local_2e0._M_string_length + 8))) {
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_2b8,0,(char *)0x0,(ulong)local_2e0._M_dataplus._M_p);
        }
        else {
          puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)paVar3);
        }
        psVar10 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_300.field_2._M_allocated_capacity = *psVar10;
          local_300.field_2._8_8_ = puVar7[3];
          local_300._M_dataplus._M_p = (pointer)paVar17;
        }
        else {
          local_300.field_2._M_allocated_capacity = *psVar10;
          local_300._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_300._M_string_length = puVar7[1];
        *puVar7 = psVar10;
        puVar7[1] = 0;
        *(undefined1 *)psVar10 = 0;
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this_00->value_map_,&local_320);
        std::__cxx11::string::_M_assign((string *)pmVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != paVar17) {
          operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != paVar3) {
          operator_delete(local_2b8._M_dataplus._M_p,
                          (ulong)(local_2b8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,
                          (ulong)(local_2e0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != paVar2) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        sVar9 = strlen(pcVar13);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2b8,pcVar13,pcVar13 + sVar9);
        anon_unknown_1::GenArrayMainBody(&local_2e0,&local_2b8);
        local_238._M_dataplus._M_p = (pointer)0x39;
        local_298 = (long ****)local_288;
        local_298 = (long ****)
                    std::__cxx11::string::_M_create((ulong *)&local_298,(ulong)&local_238);
        local_288[0] = (long ****)local_238._M_dataplus._M_p;
        builtin_strncpy((char *)((long)local_298 + 0x29),".{{OFFSE",8);
        builtin_strncpy((char *)((long)local_298 + 0x31),"T}}.v); ",8);
        ((long *****)local_298)[4] = (long ****)0x7d54455346464f45;
        ((long *****)local_298)[5] = (long ****)0x5346464f7b7b2e7d;
        ((long *****)local_298)[2] = (long ****)0x657366666f2e7d7d;
        ((long *****)local_298)[3] = (long ****)0x4c4241547b7b2874;
        *local_298 = (long ***)0x203d206f2074656c;
        ((long *****)local_298)[1] = (long ****)0x5353454343417b7b;
        local_290 = (long ****)local_238._M_dataplus._M_p;
        *(char *)((long)local_298 + (long)local_238._M_dataplus._M_p) = '\0';
        uVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          uVar12 = local_2e0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_238._M_dataplus._M_p + local_2e0._M_string_length) {
          _Var16._M_p = (pointer)(long *****)0xf;
          if ((long *****)local_298 != local_288) {
            _Var16._M_p = local_238._M_dataplus._M_p;
          }
          if (_Var16._M_p < local_238._M_dataplus._M_p + local_2e0._M_string_length)
          goto LAB_002f2e7d;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_298,0,(char *)0x0,(ulong)local_2e0._M_dataplus._M_p);
        }
        else {
LAB_002f2e7d:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_298);
        }
        ppppplVar14 = (long *****)(puVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)ppppplVar14) {
          local_300.field_2._M_allocated_capacity = (size_type)*ppppplVar14;
          local_300.field_2._8_8_ = puVar7[3];
          local_300._M_dataplus._M_p = (pointer)paVar17;
        }
        else {
          local_300.field_2._M_allocated_capacity = (size_type)*ppppplVar14;
          local_300._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_300._M_string_length = puVar7[1];
        *puVar7 = ppppplVar14;
        puVar7[1] = 0;
        *(char *)ppppplVar14 = '\0';
        puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_218);
        puVar11 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_320.field_2._M_allocated_capacity = *puVar11;
          local_320.field_2._8_8_ = puVar7[3];
          local_320._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_320.field_2._M_allocated_capacity = *puVar11;
          local_320._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_320._M_string_length = puVar7[1];
        *puVar7 = puVar11;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"{{ACCESS}}.vector(at: o) + index * {{SIZE}}","");
        GenConstructor(&local_238,local_2c0,&local_f0);
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != paVar2) {
          uVar12 = local_320.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_238._M_string_length + local_320._M_string_length) {
          uVar12 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            uVar12 = local_238.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 < local_238._M_string_length + local_320._M_string_length)
          goto LAB_002f2fcd;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_238,0,(char *)0x0,(ulong)local_320._M_dataplus._M_p);
        }
        else {
LAB_002f2fcd:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_320,(ulong)local_238._M_dataplus._M_p);
        }
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        psVar10 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_258.field_2._M_allocated_capacity = *psVar10;
          local_258.field_2._8_8_ = puVar7[3];
        }
        else {
          local_258.field_2._M_allocated_capacity = *psVar10;
          local_258._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_258._M_string_length = puVar7[1];
        *puVar7 = psVar10;
        puVar7[1] = 0;
        *(undefined1 *)psVar10 = 0;
        CodeWriter::operator+=(this_00,&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != paVar2) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != paVar17) {
          operator_delete(local_300._M_dataplus._M_p,
                          (ulong)(local_300.field_2._M_allocated_capacity + 1));
        }
        if ((long *****)local_298 != local_288) {
          operator_delete(local_298,(ulong)((long)local_288[0] + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,
                          (ulong)(local_2e0.field_2._M_allocated_capacity + 1));
        }
        local_50.field_2._M_allocated_capacity = local_2b8.field_2._M_allocated_capacity;
        local_50._M_dataplus._M_p = local_2b8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) goto LAB_002f3135;
        goto LAB_002f313d;
      }
      if ((uVar1 < 10) && (CONCAT44(local_278.enum_def._4_4_,local_278.enum_def._0_4_) != 0)) {
        local_320._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"BASEVALUE","");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_300,GenTypeBasic::swift_type[(int)local_278.base_type],
                   (allocator<char> *)&local_2e0);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this_00->value_map_,&local_320);
        std::__cxx11::string::_M_assign((string *)pmVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != paVar17) {
          operator_delete(local_300._M_dataplus._M_p,
                          (ulong)(local_300.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != paVar2) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        GenEnumDefaultValue_abi_cxx11_(&local_300,local_2c0,field);
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0x3840c0);
        puVar11 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_320.field_2._M_allocated_capacity = *puVar11;
          local_320.field_2._8_8_ = puVar7[3];
          local_320._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_320.field_2._M_allocated_capacity = *puVar11;
          local_320._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_320._M_string_length = puVar7[1];
        *puVar7 = puVar11;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_320);
        psVar10 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_1d0.field_2._M_allocated_capacity = *psVar10;
          local_1d0.field_2._8_8_ = plVar6[3];
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        }
        else {
          local_1d0.field_2._M_allocated_capacity = *psVar10;
          local_1d0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_1d0._M_string_length = plVar6[1];
        *plVar6 = (long)psVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        CodeWriter::operator+=(this_00,&local_1d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != paVar2) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        local_110.field_2._M_allocated_capacity = local_300.field_2._M_allocated_capacity;
        _Var16._M_p = local_300._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p == &local_300.field_2) goto LAB_002f314a;
      }
      else {
        if (local_278.base_type == BASE_TYPE_STRUCT) {
          if (((field->value).type.struct_def)->fixed == false) {
            local_320._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_320,
                       "{{ACCESS}}.indirect({{ACCESS}}.vector(at: o) + index * {{SIZE}})","");
            GenConstructor(&local_70,local_2c0,&local_320);
            CodeWriter::operator+=(this_00,&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_320._M_dataplus._M_p != paVar2) {
              operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1
                             );
            }
            pSVar4 = (field->value).type.struct_def;
            for (ppFVar8 = (pSVar4->fields).vec.
                           super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                ppFVar8 !=
                (pSVar4->fields).vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppFVar8 = ppFVar8 + 1) {
              if ((*ppFVar8)->key == true) {
                GenByKeyFunctions(local_2c0,*ppFVar8);
                break;
              }
            }
          }
          goto LAB_002f314a;
        }
        if (local_278.base_type != BASE_TYPE_UNION) goto LAB_002f314a;
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_130,
                   "{{ACCESS}}.directUnion({{ACCESS}}.vector(at: o) + index * {{SIZE}}) }","");
        CodeWriter::operator+=(this_00,&local_130);
        local_110.field_2._M_allocated_capacity = local_130.field_2._M_allocated_capacity;
        _Var16._M_p = local_130._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p == &local_130.field_2) goto LAB_002f314a;
      }
    }
    operator_delete(_Var16._M_p,(ulong)(local_110.field_2._M_allocated_capacity + 1));
  }
LAB_002f314a:
  if (local_218 != local_208) {
    operator_delete(local_218,local_208[0] + 1);
  }
  return;
}

Assistant:

void GenTableReaderVectorFields(const FieldDef &field) {
    std::string const_string = "return o == 0 ? {{CONSTANT}} : ";
    const auto vectortype = field.value.type.VectorType();
    code_.SetValue("SIZE", NumToString(InlineSize(vectortype)));
    code_.SetValue("HAS_FIELDVAR", namer_.Variable("has", field));
    code_ += "{{ACCESS_TYPE}} var {{HAS_FIELDVAR}}: Bool { " + GenOffset() +
             "return o == 0 ? false : true }";
    code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}Count: Int32 { " + GenOffset() +
             "return o == 0 ? 0 : {{ACCESS}}.vector(count: o) }";
    code_.SetValue("CONSTANT", IsScalar(vectortype.base_type) ? "0" : "nil");
    const auto nullable =
        IsScalar(vectortype.base_type) && !IsEnum(vectortype) ? "" : "?";

    if (vectortype.base_type != BASE_TYPE_UNION) {
      code_ += GenArrayMainBody(nullable) + GenOffset() + "\\";
    } else {
      code_ +=
          "{{ACCESS_TYPE}} func {{FIELDVAR}}<T: FlatbuffersInitializable>(at "
          "index: "
          "Int32, type: T.Type) -> T? { " +
          GenOffset() + "\\";
    }

    if (IsBool(vectortype.base_type)) {
      code_.SetValue("CONSTANT", field.value.offset == 0 ? "false" : "true");
      code_.SetValue("VALUETYPE", "Bool");
    }

    if (!IsEnum(vectortype)) code_ += const_string + "\\";

    if (IsScalar(vectortype.base_type) && !IsEnum(vectortype) &&
        !IsBool(field.value.type.base_type)) {
      code_ +=
          "{{ACCESS}}.directRead(of: {{VALUETYPE}}.self, offset: "
          "{{ACCESS}}.vector(at: o) + index * {{SIZE}}) }";
      code_ +=
          "{{ACCESS_TYPE}} var {{FIELDVAR}}: [{{VALUETYPE}}] { return "
          "{{ACCESS}}.getVector(at: {{TABLEOFFSET}}.{{OFFSET}}.v) ?? [] }";
      if (parser_.opts.mutable_buffer) code_ += GenMutateArray();
      GenUnsafeBufferPointer(field);
      return;
    }

    if (vectortype.base_type == BASE_TYPE_STRUCT &&
        field.value.type.struct_def->fixed) {
      code_ +=
          "{{ACCESS}}.directRead(of: {{VALUETYPE}}.self, offset: "
          "{{ACCESS}}.vector(at: o) + index * {{SIZE}}) }";
      code_.SetValue("FIELDMETHOD", namer_.Method("mutable", field));
      code_.SetValue("VALUETYPE", GenType(field.value.type) + Mutable());
      code_ += GenArrayMainBody(nullable) + GenOffset() + const_string +
               GenConstructor("{{ACCESS}}.vector(at: o) + index * {{SIZE}}");

      GenUnsafeBufferPointer(field);
      return;
    }

    if (IsString(vectortype)) {
      code_ +=
          "{{ACCESS}}.directString(at: {{ACCESS}}.vector(at: o) + "
          "index * {{SIZE}}) }";
      return;
    }

    if (IsEnum(vectortype)) {
      code_.SetValue("BASEVALUE", GenTypeBasic(vectortype, false));
      code_ += "return o == 0 ? {{VALUETYPE}}" + GenEnumDefaultValue(field) +
               " : {{VALUETYPE}}(rawValue: {{ACCESS}}.directRead(of: "
               "{{BASEVALUE}}.self, offset: {{ACCESS}}.vector(at: o) + "
               "index * {{SIZE}})) }";
      return;
    }
    if (vectortype.base_type == BASE_TYPE_UNION) {
      code_ +=
          "{{ACCESS}}.directUnion({{ACCESS}}.vector(at: o) + "
          "index * {{SIZE}}) }";
      return;
    }

    if (vectortype.base_type == BASE_TYPE_STRUCT &&
        !field.value.type.struct_def->fixed) {
      code_ += GenConstructor(
          "{{ACCESS}}.indirect({{ACCESS}}.vector(at: o) + index * "
          "{{SIZE}})");
      const auto &sd = *field.value.type.struct_def;
      const auto &fields = sd.fields.vec;
      for (auto kit = fields.begin(); kit != fields.end(); ++kit) {
        const auto &key_field = **kit;
        if (key_field.key) {
          GenByKeyFunctions(key_field);
          break;
        }
      }
    }
  }